

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O2

void __thiscall
duckdb::CreateSecretFunctionSet::~CreateSecretFunctionSet(CreateSecretFunctionSet *this)

{
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::CreateSecretFunction>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->functions)._M_h);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit CreateSecretFunctionSet(string &name) : name(name) {}